

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os-test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_9a8b::OSTest_ConvertFileToMmapSize_Test::TestBody
          (OSTest_ConvertFileToMmapSize_Test *this)

{
  bool bVar1;
  uint *in_RDX;
  char *pcVar2;
  _func_int **message;
  AssertionResult gtest_ar;
  string gtest_expected_message;
  AssertHelper local_40;
  ULongLong max_long_long;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30 [2];
  undefined4 local_1c;
  
  local_1c = 0x2a;
  testing::TypedEq<unsigned_long,unsigned_int>
            ((Matcher<unsigned_long> *)&max_long_long,(testing *)&local_1c,in_RDX);
  testing::Matcher<unsigned_long>::Matcher
            ((Matcher<unsigned_long> *)&gtest_expected_message,
             (Matcher<unsigned_long> *)&max_long_long);
  local_40.data_ = (AssertHelperData *)0x2a;
  testing::internal::PredicateFormatterFromMatcher<testing::Matcher<unsigned_long>>::operator()
            (&gtest_ar,(char *)&gtest_expected_message,
             (unsigned_long *)"mp::internal::ConvertFileToMmapSize(42, \"\")");
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase
            ((MatcherBase<unsigned_long> *)&gtest_expected_message);
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase
            ((MatcherBase<unsigned_long> *)&max_long_long);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_expected_message);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&max_long_long,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/os-test.cc",0xbc,
               pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&max_long_long,(Message *)&gtest_expected_message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&max_long_long);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_expected_message);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if ((char)max_long_long == '\x01') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gtest_expected_message,"negative file size",(allocator<char> *)&gtest_ar);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      mp::internal::ConvertFileToMmapSize(-1,(CStringRef)0x13fe3b);
    }
    testing::AssertionResult::operator<<
              ((AssertionResult *)&max_long_long,
               (char (*) [129])
               "Expected: mp::internal::ConvertFileToMmapSize(-1, \"\") throws an exception of type AssertionFailure.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (local_30[0].ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  {
    message = (_func_int **)0x13fe3b;
  }
  else {
    message = (_func_int **)((local_30[0].ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/os-test.cc",0xbe,
             (char *)message);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)&gtest_ar,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(local_30);
  max_long_long = 0x7fffffffffffffff;
  pcVar2 = "";
  gtest_ar._0_8_ = mp::internal::ConvertFileToMmapSize(0x7fffffffffffffff,(CStringRef)0x13fe3b);
  testing::internal::CmpHelperEQ<unsigned_long_long,unsigned_long>
            ((internal *)&gtest_expected_message,"max_long_long",
             "mp::internal::ConvertFileToMmapSize(max_long_long, \"\")",&max_long_long,
             (unsigned_long *)&gtest_ar);
  if ((char)gtest_expected_message._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_expected_message._M_string_length != 0) {
      pcVar2 = *(char **)gtest_expected_message._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/os-test.cc",199,
               pcVar2);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&gtest_expected_message._M_string_length);
  return;
}

Assistant:

TEST(OSTest, ConvertFileToMmapSize) {
  EXPECT_THAT(mp::internal::ConvertFileToMmapSize(42, ""),
              testing::TypedEq<std::size_t>(42u));
  EXPECT_ASSERT(mp::internal::ConvertFileToMmapSize(-1, ""),
                "negative file size");
  fmt::ULongLong max_size = std::numeric_limits<std::size_t>::max();
  fmt::ULongLong max_long_long = std::numeric_limits<fmt::LongLong>::max();
  if (max_size < max_long_long) {
    EXPECT_EQ(max_size, mp::internal::ConvertFileToMmapSize(max_size, ""));
    EXPECT_THROW_MSG(mp::internal::ConvertFileToMmapSize(max_size + 1, "test"),
                     mp::Error, "file test is too big");
  } else {
    EXPECT_EQ(max_long_long,
              mp::internal::ConvertFileToMmapSize(max_long_long, ""));
  }
}